

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testCreateQuoteRequest(int count)

{
  long lVar1;
  long lVar2;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  int local_544;
  undefined1 local_540 [4];
  int j;
  NoRelatedSym noRelatedSym;
  STRING local_4c0;
  QuoteReqID local_4a0;
  undefined1 local_448 [8];
  QuoteRequest massQuote;
  undefined1 local_2e8 [4];
  int i;
  OrdType ordType;
  Currency currency;
  OrderQty orderQty;
  Side side;
  StrikePrice strikePrice;
  PutOrCall putOrCall;
  undefined1 local_c8 [8];
  MaturityMonthYear maturityMonthYear;
  Symbol symbol;
  long start;
  int count_local;
  
  lVar1 = GetTickCount();
  FIX::Symbol::Symbol((Symbol *)&maturityMonthYear.super_MonthYearField.super_FieldBase.m_metrics);
  FIX::MaturityMonthYear::MaturityMonthYear((MaturityMonthYear *)local_c8);
  FIX::PutOrCall::PutOrCall((PutOrCall *)&strikePrice.super_PriceField.super_FieldBase.m_metrics);
  FIX::StrikePrice::StrikePrice((StrikePrice *)&side.super_CharField.super_FieldBase.m_metrics);
  FIX::Side::Side((Side *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
  FIX::OrderQty::OrderQty((OrderQty *)&currency.super_CurrencyField.super_FieldBase.m_metrics);
  FIX::Currency::Currency((Currency *)&ordType.super_CharField.super_FieldBase.m_metrics);
  FIX::OrdType::OrdType((OrdType *)local_2e8);
  for (massQuote.super_Message._340_4_ = 0; (int)massQuote.super_Message._340_4_ <= count + -1;
      massQuote.super_Message._340_4_ = massQuote.super_Message._340_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"1",
               (allocator<char> *)((long)&noRelatedSym.super_Group.m_delim + 3));
    FIX::QuoteReqID::QuoteReqID(&local_4a0,&local_4c0);
    FIX42::QuoteRequest::QuoteRequest((QuoteRequest *)local_448,&local_4a0);
    FIX::QuoteReqID::~QuoteReqID(&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&noRelatedSym.super_Group.m_delim + 3));
    FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)local_540);
    for (local_544 = 1; local_544 < 0xb; local_544 = local_544 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"IBM",&local_569);
      FIX::StringField::setValue
                ((StringField *)&maturityMonthYear.super_MonthYearField.super_FieldBase.m_metrics,
                 &local_568);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator(&local_569);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"022003",&local_591);
      FIX::StringField::setValue((StringField *)local_c8,&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::allocator<char>::~allocator(&local_591);
      FIX::IntField::setValue((IntField *)&strikePrice.super_PriceField.super_FieldBase.m_metrics,0)
      ;
      FIX::DoubleField::setValue
                ((DoubleField *)&side.super_CharField.super_FieldBase.m_metrics,120.0,0);
      FIX::CharField::setValue((CharField *)&orderQty.super_QtyField.super_FieldBase.m_metrics,'1');
      FIX::DoubleField::setValue
                ((DoubleField *)&currency.super_CurrencyField.super_FieldBase.m_metrics,100.0,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"USD",&local_5b9);
      FIX::StringField::setValue
                ((StringField *)&ordType.super_CharField.super_FieldBase.m_metrics,&local_5b8);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::allocator<char>::~allocator(&local_5b9);
      FIX::CharField::setValue((CharField *)local_2e8,'1');
      FIX42::QuoteRequest::NoRelatedSym::set
                ((NoRelatedSym *)local_540,
                 (Symbol *)&maturityMonthYear.super_MonthYearField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::set
                ((NoRelatedSym *)local_540,(MaturityMonthYear *)local_c8);
      FIX42::QuoteRequest::NoRelatedSym::set
                ((NoRelatedSym *)local_540,
                 (PutOrCall *)&strikePrice.super_PriceField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::set
                ((NoRelatedSym *)local_540,
                 (StrikePrice *)&side.super_CharField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::set
                ((NoRelatedSym *)local_540,
                 (Side *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::set
                ((NoRelatedSym *)local_540,
                 (OrderQty *)&currency.super_CurrencyField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::set
                ((NoRelatedSym *)local_540,
                 (Currency *)&ordType.super_CharField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_540,(OrdType *)local_2e8);
      FIX::Message::addGroup((Message *)local_448,(Group *)local_540);
      FIX::FieldMap::clear();
    }
    FIX42::QuoteRequest::NoRelatedSym::~NoRelatedSym((NoRelatedSym *)local_540);
    FIX42::QuoteRequest::~QuoteRequest((QuoteRequest *)local_448);
  }
  lVar2 = GetTickCount();
  FIX::OrdType::~OrdType((OrdType *)local_2e8);
  FIX::Currency::~Currency((Currency *)&ordType.super_CharField.super_FieldBase.m_metrics);
  FIX::OrderQty::~OrderQty((OrderQty *)&currency.super_CurrencyField.super_FieldBase.m_metrics);
  FIX::Side::~Side((Side *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
  FIX::StrikePrice::~StrikePrice((StrikePrice *)&side.super_CharField.super_FieldBase.m_metrics);
  FIX::PutOrCall::~PutOrCall((PutOrCall *)&strikePrice.super_PriceField.super_FieldBase.m_metrics);
  FIX::MaturityMonthYear::~MaturityMonthYear((MaturityMonthYear *)local_c8);
  FIX::Symbol::~Symbol((Symbol *)&maturityMonthYear.super_MonthYearField.super_FieldBase.m_metrics);
  return lVar2 - lVar1;
}

Assistant:

long testCreateQuoteRequest(int count) {
  count = count - 1;

  long start = GetTickCount();
  FIX::Symbol symbol;
  FIX::MaturityMonthYear maturityMonthYear;
  FIX::PutOrCall putOrCall;
  FIX::StrikePrice strikePrice;
  FIX::Side side;
  FIX::OrderQty orderQty;
  FIX::Currency currency;
  FIX::OrdType ordType;

  for (int i = 0; i <= count; ++i) {
    FIX42::QuoteRequest massQuote(FIX::QuoteReqID("1"));
    FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

    for (int j = 1; j <= 10; ++j) {
      symbol.setValue("IBM");
      maturityMonthYear.setValue("022003");
      putOrCall.setValue(FIX::PutOrCall_PUT);
      strikePrice.setValue(120);
      side.setValue(FIX::Side_BUY);
      orderQty.setValue(100);
      currency.setValue("USD");
      ordType.setValue(FIX::OrdType_MARKET);
      noRelatedSym.set(symbol);
      noRelatedSym.set(maturityMonthYear);
      noRelatedSym.set(putOrCall);
      noRelatedSym.set(strikePrice);
      noRelatedSym.set(side);
      noRelatedSym.set(orderQty);
      noRelatedSym.set(currency);
      noRelatedSym.set(ordType);
      massQuote.addGroup(noRelatedSym);
      noRelatedSym.clear();
    }
  }

  return GetTickCount() - start;
}